

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O0

bool CheckConfigFileVariable
               (TCascStorage *hs,char *szLinePtr,char *szLineEnd,char *szVarName,
               PARSE_VARIABLE PfnParseProc,void *pvParseParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char local_98 [8];
  char szVariableName [80];
  void *pvParseParam_local;
  PARSE_VARIABLE PfnParseProc_local;
  char *szVarName_local;
  char *szLineEnd_local;
  char *szLinePtr_local;
  TCascStorage *hs_local;
  
  szLineEnd_local = CaptureSingleString(szLinePtr,szLineEnd,local_98,0x50);
  if (szLineEnd_local == (char *)0x0) {
    hs_local._7_1_ = false;
  }
  else {
    bVar1 = CheckWildCard(local_98,szVarName);
    if (bVar1) {
      while( true ) {
        bVar1 = false;
        if (szLineEnd_local < szLineEnd) {
          bVar2 = IsWhiteSpace(szLineEnd_local);
          bVar1 = true;
          if (!bVar2) {
            bVar1 = *szLineEnd_local == '=';
          }
        }
        if (!bVar1) break;
        szLineEnd_local = szLineEnd_local + 1;
      }
      if (szLineEnd_local < szLineEnd) {
        iVar3 = (*PfnParseProc)(hs,local_98,szLineEnd_local,szLineEnd,pvParseParam);
        hs_local._7_1_ = iVar3 == 0;
      }
      else {
        hs_local._7_1_ = false;
      }
    }
    else {
      hs_local._7_1_ = false;
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool CheckConfigFileVariable(
    TCascStorage * hs,                  // Pointer to storage structure
    const char * szLinePtr,             // Pointer to the begin of the line
    const char * szLineEnd,             // Pointer to the end of the line
    const char * szVarName,             // Pointer to the variable to check
    PARSE_VARIABLE PfnParseProc,        // Pointer to the parsing function
    void * pvParseParam)                // Pointer to the parameter passed to parsing function
{
    char szVariableName[MAX_VAR_NAME];

    // Capture the variable from the line
    szLinePtr = CaptureSingleString(szLinePtr, szLineEnd, szVariableName, sizeof(szVariableName));
    if (szLinePtr == NULL)
        return false;

    // Verify whether this is the variable
    if (!CheckWildCard(szVariableName, szVarName))
        return false;

    // Skip the spaces and '='
    while (szLinePtr < szLineEnd && (IsWhiteSpace(szLinePtr) || szLinePtr[0] == '='))
        szLinePtr++;

    // Call the parsing function only if there is some data
    if (szLinePtr >= szLineEnd)
        return false;

    return (PfnParseProc(hs, szVariableName, szLinePtr, szLineEnd, pvParseParam) == ERROR_SUCCESS);
}